

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeAssociativeContainer<QMap<QFont::Tag,float>>
          (QDataStream *s,QMap<QFont::Tag,_float> *c)

{
  long lVar1;
  bool bVar2;
  float *pfVar3;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDataStream *in_stack_ffffffffffffffa8;
  QDataStream *in_stack_ffffffffffffffb0;
  QDataStream *in_stack_ffffffffffffffb8;
  Tag tag;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<QFont::Tag,_float>::size((QMap<QFont::Tag,_float> *)in_stack_ffffffffffffffb0);
  bVar2 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0x731c41);
  if (bVar2) {
    QMap<QFont::Tag,_float>::constBegin((QMap<QFont::Tag,_float> *)in_stack_ffffffffffffffa8);
    QMap<QFont::Tag,_float>::constEnd((QMap<QFont::Tag,_float> *)in_stack_ffffffffffffffa8);
    while( true ) {
      tag.m_value = (quint32)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      bVar2 = ::operator!=((const_iterator *)in_stack_ffffffffffffffb0,
                           (const_iterator *)in_stack_ffffffffffffffa8);
      if (!bVar2) break;
      in_stack_ffffffffffffffb0 = in_RDI;
      QMap<QFont::Tag,_float>::const_iterator::key((const_iterator *)0x731cb3);
      in_stack_ffffffffffffffb8 = ::operator<<(in_stack_ffffffffffffffb0,tag);
      pfVar3 = QMap<QFont::Tag,_float>::const_iterator::value((const_iterator *)0x731cd6);
      QDataStream::operator<<(in_stack_ffffffffffffffb8,*pfVar3);
      QMap<QFont::Tag,_float>::const_iterator::operator++
                ((const_iterator *)in_stack_ffffffffffffffb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}